

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall Centaurus::Grammar<unsigned_char>::optimize(Grammar<unsigned_char> *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_> *p;
  iterator __end0;
  iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
  *__range2;
  Grammar<unsigned_char> *this_local;
  
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
           ::begin(&this->m_networks);
  p = (pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_> *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
      ::end(&this->m_networks);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                         *)&p);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_false,_true>
             ::operator*(&__end0);
    ATNMachine<unsigned_char>::drop_passthrough_nodes(&ppVar2->second);
    std::__detail::
    _Node_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_false,_true>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

virtual void optimize() override
    {
        for (auto& p : m_networks)
        {
            p.second.drop_passthrough_nodes();
        }
    }